

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_ecf33::DirectoryTreeSignatureTask::provideValue
          (DirectoryTreeSignatureTask *this,TaskInterface ti,uintptr_t inputID,KeyType *key,
          ValueType *valueData)

{
  uint64_t y;
  bool bVar1;
  size_type sVar2;
  undefined8 uVar3;
  reference pvVar4;
  reference pvVar5;
  FileInfo *this_00;
  ulong __n;
  Twine *pTVar6;
  StringRef SVar7;
  StringRef path;
  bool local_579;
  unsigned_long index;
  char *local_560;
  BuildKey local_558;
  KeyType local_538;
  Twine local_518;
  Twine local_500;
  Twine local_4e8;
  Twine local_4d0;
  StringRef local_4b8;
  undefined1 local_4a8 [8];
  SmallString<256U> childPath_1;
  BuildValue value_1;
  value_type *childResult;
  uintptr_t index_1;
  char *local_310;
  BuildKey local_308;
  KeyType local_2e8;
  SubpathInfo local_2c8;
  Twine local_270;
  Twine local_258;
  Twine local_240;
  Twine local_228;
  StringRef local_210;
  undefined1 local_200 [8];
  SmallString<256U> childPath;
  size_t i;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> filenames;
  undefined1 local_c8 [8];
  BuildValue value;
  ValueType *valueData_local;
  KeyType *key_local;
  uintptr_t inputID_local;
  DirectoryTreeSignatureTask *this_local;
  TaskInterface ti_local;
  
  ti_local.impl = ti.ctx;
  this_local = (DirectoryTreeSignatureTask *)ti.impl;
  value.stringValues.size = (uint64_t)valueData;
  if (inputID == 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&this->directoryValue,valueData);
    llbuild::buildsystem::BuildValue::fromData
              ((BuildValue *)local_c8,(ValueType *)value.stringValues.size);
    bVar1 = llbuild::basic::StringList::isEmpty(&this->filters);
    if (((bVar1) &&
        (bVar1 = llbuild::buildsystem::BuildValue::isDirectoryContents((BuildValue *)local_c8),
        !bVar1)) ||
       ((bVar1 = llbuild::basic::StringList::isEmpty(&this->filters), !bVar1 &&
        (bVar1 = llbuild::buildsystem::BuildValue::isFilteredDirectoryContents
                           ((BuildValue *)local_c8), !bVar1)))) {
      filenames.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    }
    else {
      bVar1 = llbuild::buildsystem::BuildValue::isFilteredDirectoryContents((BuildValue *)local_c8);
      local_579 = true;
      if (!bVar1) {
        local_579 = llbuild::buildsystem::BuildValue::isDirectoryContents((BuildValue *)local_c8);
      }
      if (local_579 == false) {
        __assert_fail("value.isFilteredDirectoryContents() || value.isDirectoryContents()",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp"
                      ,0x515,
                      "virtual void (anonymous namespace)::DirectoryTreeSignatureTask::provideValue(TaskInterface, uintptr_t, const KeyType &, const ValueType &)"
                     );
      }
      llbuild::buildsystem::BuildValue::getDirectoryContents
                ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&i,
                 (BuildValue *)local_c8);
      childPath.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xf8].
      super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
      childPath.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xf9].
      super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
      childPath.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xfa].
      super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
      childPath.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xfb].
      super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
      childPath.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xfc].
      super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
      childPath.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xfd].
      super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
      childPath.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xfe].
      super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
      childPath.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xff].
      super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
      for (; uVar3 = childPath.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.
                     InlineElts._248_8_,
          sVar2 = std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::size
                            ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&i),
          uVar3 != sVar2;
          childPath.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts.
          _248_8_ = childPath.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.
                    InlineElts._248_8_ + 1) {
        ti_local.ctx = &this->path;
        uVar3 = std::__cxx11::string::data();
        local_210.Data = (char *)uVar3;
        uVar3 = std::__cxx11::string::length();
        local_210.Length = uVar3;
        llvm::SmallString<256U>::SmallString((SmallString<256U> *)local_200,local_210);
        pvVar4 = std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::operator[]
                           ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&i,
                            childPath.super_SmallVector<char,_256U>.
                            super_SmallVectorStorage<char,_256U>.InlineElts._248_8_);
        llvm::Twine::Twine(&local_228,pvVar4);
        llvm::Twine::Twine(&local_240,"");
        llvm::Twine::Twine(&local_258,"");
        llvm::Twine::Twine(&local_270,"");
        pTVar6 = &local_258;
        llvm::sys::path::append
                  ((SmallVectorImpl<char> *)local_200,&local_228,&local_240,pTVar6,&local_270);
        pvVar4 = std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::operator[]
                           ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&i,
                            childPath.super_SmallVector<char,_256U>.
                            super_SmallVectorStorage<char,_256U>.InlineElts._248_8_);
        llvm::StringRef::operator_cast_to_string(&local_2c8.filename,pvVar4);
        memset(&local_2c8.value,0,0x18);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_2c8.value);
        llvm::Optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::Optional
                  (&local_2c8.directorySignatureValue,None);
        std::
        vector<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo>_>
        ::emplace_back<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo>
                  (&this->childResults,&local_2c8);
        SubpathInfo::~SubpathInfo(&local_2c8);
        SVar7 = llvm::SmallString::operator_cast_to_StringRef((SmallString *)local_200);
        index_1 = (uintptr_t)SVar7.Data;
        local_310 = (char *)SVar7.Length;
        SVar7.Length = (size_t)pTVar6;
        SVar7.Data = local_310;
        llbuild::buildsystem::BuildKey::makeNode(&local_308,(BuildKey *)index_1,SVar7);
        llbuild::buildsystem::BuildKey::toData(&local_2e8,&local_308);
        llbuild::core::TaskInterface::request
                  ((TaskInterface *)&this_local,&local_2e8,
                   childPath.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.
                   InlineElts._248_8_ + 1);
        llbuild::core::KeyType::~KeyType(&local_2e8);
        llbuild::buildsystem::BuildKey::~BuildKey(&local_308);
        llvm::SmallString<256U>::~SmallString((SmallString<256U> *)local_200);
      }
      filenames.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~vector
                ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&i);
    }
    llbuild::buildsystem::BuildValue::~BuildValue((BuildValue *)local_c8);
  }
  else if ((inputID == 0) ||
          (sVar2 = std::
                   vector<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo>_>
                   ::size(&this->childResults), sVar2 + 1 <= inputID)) {
    sVar2 = std::
            vector<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo>_>
            ::size(&this->childResults);
    __n = (inputID - 1) - sVar2;
    sVar2 = std::
            vector<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo>_>
            ::size(&this->childResults);
    y = value.stringValues.size;
    if (sVar2 <= __n) {
      __assert_fail("index < childResults.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp"
                    ,0x538,
                    "virtual void (anonymous namespace)::DirectoryTreeSignatureTask::provideValue(TaskInterface, uintptr_t, const KeyType &, const ValueType &)"
                   );
    }
    pvVar5 = std::
             vector<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo>_>
             ::operator[](&this->childResults,__n);
    llvm::Optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::operator=
              (&pvVar5->directorySignatureValue,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)y);
  }
  else {
    pvVar5 = std::
             vector<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo>_>
             ::operator[](&this->childResults,inputID - 1);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&pvVar5->value,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)value.stringValues.size);
    llbuild::buildsystem::BuildValue::fromData
              ((BuildValue *)
               (childPath_1.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.
                InlineElts + 0xf8),(ValueType *)value.stringValues.size);
    bVar1 = llbuild::buildsystem::BuildValue::isExistingInput
                      ((BuildValue *)
                       (childPath_1.super_SmallVector<char,_256U>.
                        super_SmallVectorStorage<char,_256U>.InlineElts + 0xf8));
    if (bVar1) {
      this_00 = llbuild::buildsystem::BuildValue::getOutputInfo
                          ((BuildValue *)
                           (childPath_1.super_SmallVector<char,_256U>.
                            super_SmallVectorStorage<char,_256U>.InlineElts + 0xf8));
      bVar1 = llbuild::basic::FileInfo::isDirectory(this_00);
      if (bVar1) {
        uVar3 = std::__cxx11::string::data();
        local_4b8.Data = (char *)uVar3;
        uVar3 = std::__cxx11::string::length();
        local_4b8.Length = uVar3;
        llvm::SmallString<256U>::SmallString((SmallString<256U> *)local_4a8,local_4b8);
        llvm::Twine::Twine(&local_4d0,&pvVar5->filename);
        llvm::Twine::Twine(&local_4e8,"");
        llvm::Twine::Twine(&local_500,"");
        llvm::Twine::Twine(&local_518,"");
        pTVar6 = &local_518;
        llvm::sys::path::append
                  ((SmallVectorImpl<char> *)local_4a8,&local_4d0,&local_4e8,&local_500,pTVar6);
        SVar7 = llvm::SmallString::operator_cast_to_StringRef((SmallString *)local_4a8);
        path.Length = &this->filters;
        index = (unsigned_long)SVar7.Data;
        local_560 = (char *)SVar7.Length;
        path.Data = local_560;
        llbuild::buildsystem::BuildKey::makeDirectoryTreeSignature
                  (&local_558,(BuildKey *)index,path,(StringList *)pTVar6);
        llbuild::buildsystem::BuildKey::toData(&local_538,&local_558);
        sVar2 = std::
                vector<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo>_>
                ::size(&this->childResults);
        llbuild::core::TaskInterface::request
                  ((TaskInterface *)&this_local,&local_538,sVar2 + 1 + (inputID - 1));
        llbuild::core::KeyType::~KeyType(&local_538);
        llbuild::buildsystem::BuildKey::~BuildKey(&local_558);
        llvm::SmallString<256U>::~SmallString((SmallString<256U> *)local_4a8);
      }
    }
    filenames.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    llbuild::buildsystem::BuildValue::~BuildValue
              ((BuildValue *)
               (childPath_1.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.
                InlineElts + 0xf8));
  }
  return;
}

Assistant:

virtual void provideValue(TaskInterface ti, uintptr_t inputID,
                            const KeyType& key, const ValueType& valueData) override {
    // The first input is the directory contents.
    if (inputID == 0) {
      // Record the value for the directory.
      directoryValue = valueData;

      // Request the inputs for each subpath.
      auto value = BuildValue::fromData(valueData);
      if ((filters.isEmpty() && !value.isDirectoryContents()) ||
          (!filters.isEmpty() && !value.isFilteredDirectoryContents())) {
        return;
      }

      assert(value.isFilteredDirectoryContents() || value.isDirectoryContents());
      auto filenames = value.getDirectoryContents();
      for (size_t i = 0; i != filenames.size(); ++i) {
        SmallString<256> childPath{ path };
        llvm::sys::path::append(childPath, filenames[i]);
        childResults.emplace_back(SubpathInfo{ filenames[i], {}, None });
        ti.request(BuildKey::makeNode(childPath).toData(), /*inputID=*/1 + i);
      }
      return;
    }

    // If the input is a child, add it to the collection and dispatch a
    // directory request if needed.
    if (inputID >= 1 && inputID < 1 + childResults.size()) {
      auto index = inputID - 1;
      auto& childResult = childResults[index];
      childResult.value = valueData;

      // If this node is a directory, request its signature recursively.
      auto value = BuildValue::fromData(valueData);
      if (value.isExistingInput()) {
        if (value.getOutputInfo().isDirectory()) {
          SmallString<256> childPath{ path };
          llvm::sys::path::append(childPath, childResult.filename);

          ti.request(BuildKey::makeDirectoryTreeSignature(childPath,
                                                          filters).toData(),
                     /*inputID=*/1 + childResults.size() + index);
        }
      }
      return;
    }

    // Otherwise, the input should be a directory signature.
    auto index = inputID - 1 - childResults.size();
    assert(index < childResults.size());
    childResults[index].directorySignatureValue = valueData;
  }